

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

int si9ma::BinaryTree::get_left_most_layer(TreeNode *head)

{
  int local_1c;
  TreeNode *pTStack_18;
  int count;
  TreeNode *head_local;
  
  if (head == (TreeNode *)0x0) {
    head_local._4_4_ = 0;
  }
  else {
    local_1c = 0;
    for (pTStack_18 = head; pTStack_18 != (TreeNode *)0x0; pTStack_18 = pTStack_18->left) {
      local_1c = local_1c + 1;
    }
    head_local._4_4_ = local_1c;
  }
  return head_local._4_4_;
}

Assistant:

int BinaryTree::get_left_most_layer(const si9ma::TreeNode *head) {
        if (head == nullptr)
            return 0;

        int count = 0;
        while (head != nullptr){
            count ++;
            head = head->left;
        }

        return count;
    }